

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldDataPdu.cpp
# Opt level: O1

void __thiscall DIS::MinefieldDataPdu::unmarshal(MinefieldDataPdu *this,DataStream *dataStream)

{
  uchar *c;
  uchar *c_00;
  pointer *ppVVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer pVVar4;
  pointer pVVar5;
  iterator __position;
  pointer pVVar6;
  pointer pTVar7;
  ulong uVar8;
  TwoByteChunk x;
  Vector3Float local_48;
  
  MinefieldFamilyPdu::unmarshal(&this->super_MinefieldFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_minefieldID,dataStream);
  EntityID::unmarshal(&this->_requestingEntityID,dataStream);
  DataStream::operator>>(dataStream,&this->_minefieldSequenceNumbeer);
  DataStream::operator>>(dataStream,&this->_requestID);
  DataStream::operator>>(dataStream,&this->_pduSequenceNumber);
  DataStream::operator>>(dataStream,&this->_numberOfPdus);
  c = &this->_numberOfMinesInThisPdu;
  DataStream::operator>>(dataStream,c);
  c_00 = &this->_numberOfSensorTypes;
  DataStream::operator>>(dataStream,c_00);
  DataStream::operator>>(dataStream,&this->_pad2);
  DataStream::operator>>(dataStream,&this->_dataFilter);
  EntityType::unmarshal(&this->_mineType,dataStream);
  pTVar2 = (this->_sensorTypes).
           super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = (this->_sensorTypes).
           super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar7 = pTVar2;
  if (pTVar3 != pTVar2) {
    do {
      (**pTVar7->_vptr_TwoByteChunk)(pTVar7);
      pTVar7 = pTVar7 + 1;
    } while (pTVar7 != pTVar3);
    (this->_sensorTypes).super__Vector_base<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>.
    _M_impl.super__Vector_impl_data._M_finish = pTVar2;
  }
  if (*c_00 != '\0') {
    uVar8 = 0;
    do {
      TwoByteChunk::TwoByteChunk((TwoByteChunk *)&local_48);
      TwoByteChunk::unmarshal((TwoByteChunk *)&local_48,dataStream);
      std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::push_back
                (&this->_sensorTypes,(value_type *)&local_48);
      TwoByteChunk::~TwoByteChunk((TwoByteChunk *)&local_48);
      uVar8 = uVar8 + 1;
    } while (uVar8 < *c_00);
  }
  DataStream::operator>>(dataStream,&this->_pad3);
  pVVar4 = (this->_mineLocation).
           super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar5 = (this->_mineLocation).
           super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar6 = pVVar4;
  if (pVVar5 != pVVar4) {
    do {
      (**pVVar6->_vptr_Vector3Float)(pVVar6);
      pVVar6 = pVVar6 + 1;
    } while (pVVar6 != pVVar5);
    (this->_mineLocation).super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar4;
  }
  if (*c != '\0') {
    uVar8 = 0;
    do {
      Vector3Float::Vector3Float(&local_48);
      Vector3Float::unmarshal(&local_48,dataStream);
      __position._M_current =
           (this->_mineLocation).
           super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_mineLocation).
          super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<DIS::Vector3Float,std::allocator<DIS::Vector3Float>>::
        _M_realloc_insert<DIS::Vector3Float_const&>
                  ((vector<DIS::Vector3Float,std::allocator<DIS::Vector3Float>> *)
                   &this->_mineLocation,__position,&local_48);
      }
      else {
        (__position._M_current)->_vptr_Vector3Float = (_func_int **)&PTR__Vector3Float_001a17c0;
        (__position._M_current)->_x = local_48._x;
        (__position._M_current)->_y = local_48._y;
        (__position._M_current)->_z = local_48._z;
        ppVVar1 = &(this->_mineLocation).
                   super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      Vector3Float::~Vector3Float(&local_48);
      uVar8 = uVar8 + 1;
    } while (uVar8 < *c);
  }
  return;
}

Assistant:

void MinefieldDataPdu::unmarshal(DataStream& dataStream)
{
    MinefieldFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _minefieldID.unmarshal(dataStream);
    _requestingEntityID.unmarshal(dataStream);
    dataStream >> _minefieldSequenceNumbeer;
    dataStream >> _requestID;
    dataStream >> _pduSequenceNumber;
    dataStream >> _numberOfPdus;
    dataStream >> _numberOfMinesInThisPdu;
    dataStream >> _numberOfSensorTypes;
    dataStream >> _pad2;
    dataStream >> _dataFilter;
    _mineType.unmarshal(dataStream);

     _sensorTypes.clear();
     for(size_t idx = 0; idx < _numberOfSensorTypes; idx++)
     {
        TwoByteChunk x;
        x.unmarshal(dataStream);
        _sensorTypes.push_back(x);
     }
    dataStream >> _pad3;

     _mineLocation.clear();
     for(size_t idx = 0; idx < _numberOfMinesInThisPdu; idx++)
     {
        Vector3Float x;
        x.unmarshal(dataStream);
        _mineLocation.push_back(x);
     }
}